

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

TCGv_i32 get_src2(DisasContext_conflict8 *dc,uint insn)

{
  TCGContext_conflict8 *tcg_ctx;
  TCGv_i32 pTVar1;
  
  if ((insn >> 0xd & 1) == 0) {
    pTVar1 = gen_load_gpr(dc,insn & 0x1f);
    return pTVar1;
  }
  tcg_ctx = dc->uc->tcg_ctx;
  pTVar1 = get_temp_tl(dc);
  tcg_gen_movi_i64_sparc64(tcg_ctx,pTVar1,(long)((ulong)insn << 0x33) >> 0x33);
  return pTVar1;
}

Assistant:

static TCGv get_src2(DisasContext *dc, unsigned int insn)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    if (IS_IMM) { /* immediate */
        target_long simm = GET_FIELDs(insn, 19, 31);
        TCGv t = get_temp_tl(dc);
        tcg_gen_movi_tl(tcg_ctx, t, simm);
        return t;
    } else {      /* register */
        unsigned int rs2 = GET_FIELD(insn, 27, 31);
        return gen_load_gpr(dc, rs2);
    }
}